

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::parse_range_header(string *s,Ranges *ranges)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  bool all_valid_ranges;
  anon_class_1_0_00000001 is_valid;
  function<void_(const_char_*,_const_char_*)> local_50;
  anon_class_24_3_3716034d local_30;
  
  if ((7 < s->_M_string_length) &&
     (iVar3 = ::std::__cxx11::string::compare((ulong)s,0,(char *)0x6), iVar3 == 0)) {
    sVar1 = s->_M_string_length;
    local_30.all_valid_ranges = &all_valid_ranges;
    all_valid_ranges = true;
    pcVar2 = (s->_M_dataplus)._M_p;
    local_30.is_valid = &is_valid;
    local_30.ranges = ranges;
    ::std::function<void(char_const*,char_const*)>::
    function<httplib::detail::parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)::_lambda(char_const*,char_const*)_1_,void>
              ((function<void(char_const*,char_const*)> *)&local_50,&local_30);
    split(pcVar2 + 6,pcVar2 + sVar1,',',&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    return (bool)((ranges->
                  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_start !=
                  (ranges->
                  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish & all_valid_ranges);
  }
  return false;
}

Assistant:

inline bool parse_range_header(const std::string &s, Ranges &ranges) try {
#endif
  auto is_valid = [](const std::string &str) {
    return std::all_of(str.cbegin(), str.cend(),
                       [](unsigned char c) { return std::isdigit(c); });
  };

  if (s.size() > 7 && s.compare(0, 6, "bytes=") == 0) {
    const auto pos = static_cast<size_t>(6);
    const auto len = static_cast<size_t>(s.size() - 6);
    auto all_valid_ranges = true;
    split(&s[pos], &s[pos + len], ',', [&](const char *b, const char *e) {
      if (!all_valid_ranges) { return; }

      const auto it = std::find(b, e, '-');
      if (it == e) {
        all_valid_ranges = false;
        return;
      }

      const auto lhs = std::string(b, it);
      const auto rhs = std::string(it + 1, e);
      if (!is_valid(lhs) || !is_valid(rhs)) {
        all_valid_ranges = false;
        return;
      }

      const auto first =
          static_cast<ssize_t>(lhs.empty() ? -1 : std::stoll(lhs));
      const auto last =
          static_cast<ssize_t>(rhs.empty() ? -1 : std::stoll(rhs));
      if ((first == -1 && last == -1) ||
          (first != -1 && last != -1 && first > last)) {
        all_valid_ranges = false;
        return;
      }

      ranges.emplace_back(first, last);
    });
    return all_valid_ranges && !ranges.empty();
  }
  return false;
#ifdef CPPHTTPLIB_NO_EXCEPTIONS
}
#else
} catch (...) { return false; }